

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

void __thiscall
capnp::JsonCodec::JsonValueHandler::encode
          (JsonValueHandler *this,JsonCodec *codec,Reader input,Builder output)

{
  uint uVar1;
  PointerReader other;
  ushort uVar2;
  ulong uVar3;
  WirePointer *pWVar4;
  undefined4 uStack_6c;
  PointerBuilder local_48;
  
  uVar1 = output._builder.dataSize >> 3;
  if (input.reader.dataSize >> 3 <= output._builder.dataSize >> 3) {
    uVar1 = input.reader.dataSize >> 3;
  }
  memcpy(output._builder.data,input.reader.data,(ulong)uVar1);
  uVar2 = output._builder.pointerCount;
  if (input.reader.pointerCount < output._builder.pointerCount) {
    uVar2 = input.reader.pointerCount;
  }
  if (uVar2 != 0) {
    uVar3 = (ulong)uVar2;
    pWVar4 = input.reader.pointers;
    do {
      local_48.segment = output._builder.segment;
      local_48.capTable = output._builder.capTable;
      other._28_4_ = uStack_6c;
      other.nestingLimit = input.reader.nestingLimit;
      other.pointer = pWVar4;
      other.segment = (SegmentReader *)SUB168(input.reader._0_16_,0);
      other.capTable = (CapTableReader *)SUB168(input.reader._0_16_,8);
      local_48.pointer = output._builder.pointers;
      capnp::_::PointerBuilder::copyFrom(&local_48,other,false);
      pWVar4 = pWVar4 + 1;
      output._builder.pointers = output._builder.pointers + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

kj::String JsonCodec::encode(DynamicValue::Reader value, Type type) const {
  MallocMessageBuilder message(128);
  // Use a smaller initial segment size, this significantly improves performance when encoding
  // short strings.

  auto json = message.getRoot<JsonValue>();
  encode(value, type, json);
  return encodeRaw(json);
}